

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

void fill_insn(cs_struct *handle,cs_insn *insn,char *buffer,MCInst *mci,PostPrinter_t postprinter,
              uint8_t *code)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  size_t __n;
  char *__src;
  
  uVar2 = insn->size;
  __n = 0x10;
  if (uVar2 < 0x10) {
    __n = (size_t)uVar2;
  }
  memcpy(insn->bytes,code + (uVar2 - __n),__n);
  insn->size = (uint16_t)__n;
  uVar3 = MCInst_getOpcodePub(mci);
  if (uVar3 != 0) {
    uVar3 = MCInst_getOpcodePub(mci);
    insn->id = uVar3;
  }
  if (postprinter != (PostPrinter_t)0x0) {
    (*postprinter)((csh)handle,insn,buffer,mci);
  }
  pcVar4 = insn->mnemonic;
  __src = buffer + 1;
  do {
    bVar1 = __src[-1];
    if (bVar1 == 0x7c) {
      __src[-1] = ' ';
    }
    else if ((bVar1 < 0x21) && ((0x100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      *pcVar4 = '\0';
      if (__src[-1] == '\0') {
        insn->op_str[0] = '\0';
      }
      else {
        for (; (*__src == ' ' || (*__src == '\t')); __src = __src + 1) {
        }
        strncpy(insn->op_str,__src,0x9f);
        insn->op_str[0x9f] = '\0';
      }
      return;
    }
    *pcVar4 = __src[-1];
    pcVar4 = pcVar4 + 1;
    __src = __src + 1;
  } while( true );
}

Assistant:

static void fill_insn(struct cs_struct *handle, cs_insn *insn, char *buffer, MCInst *mci,
		PostPrinter_t postprinter, const uint8_t *code)
{
#ifndef CAPSTONE_DIET
	char *sp, *mnem;
#endif
	uint16_t copy_size = MIN(sizeof(insn->bytes), insn->size);

	// fill the instruction bytes.
	// we might skip some redundant bytes in front in the case of X86
	memcpy(insn->bytes, code + insn->size - copy_size, copy_size);
	insn->size = copy_size;

	// alias instruction might have ID saved in OpcodePub
	if (MCInst_getOpcodePub(mci))
		insn->id = MCInst_getOpcodePub(mci);

	// post printer handles some corner cases (hacky)
	if (postprinter)
		postprinter((csh)handle, insn, buffer, mci);

#ifndef CAPSTONE_DIET
	// fill in mnemonic & operands
	// find first space or tab
	sp = buffer;
	mnem = insn->mnemonic;
	for (sp = buffer; *sp; sp++) {
		if (*sp == ' '|| *sp == '\t')
			break;
		if (*sp == '|')	// lock|rep prefix for x86
			*sp = ' ';
		// copy to @mnemonic
		*mnem = *sp;
		mnem++;
	}

	*mnem = '\0';

	// copy @op_str
	if (*sp) {
		// find the next non-space char
		sp++;
		for (; ((*sp == ' ') || (*sp == '\t')); sp++);
		strncpy(insn->op_str, sp, sizeof(insn->op_str) - 1);
		insn->op_str[sizeof(insn->op_str) - 1] = '\0';
	} else
		insn->op_str[0] = '\0';
#endif
}